

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

int read_nal_unit(h264_stream_t *h,uint8_t *buf,int size)

{
  nal_t *pnVar1;
  sps_subset_t *psVar2;
  sps_subset_t *psVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  anon_union_8_1_8e248099_for_sps_subset_t_1 aVar6;
  undefined7 uVar7;
  int iVar8;
  byte *rbsp_buf;
  bs_t *b;
  byte *pbVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  _Bool _Var16;
  int rbsp_size;
  int nal_size;
  int local_38;
  int local_34;
  
  pnVar1 = h->nal;
  _local_38 = CONCAT44(size,size);
  rbsp_buf = (byte *)calloc(1,(long)size);
  iVar8 = nal_to_rbsp(buf,&local_34,rbsp_buf,&local_38);
  if (iVar8 < 0) goto LAB_0012224d;
  lVar14 = (long)local_38;
  b = (bs_t *)malloc(0x20);
  b->start = rbsp_buf;
  b->p = rbsp_buf;
  pbVar9 = rbsp_buf + lVar14;
  b->end = pbVar9;
  b->bits_left = 7;
  uVar10 = 0;
  uVar12 = 7;
  iVar8 = 1;
  pbVar11 = rbsp_buf;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    uVar13 = 0;
    if (pbVar11 < pbVar9) {
      uVar13 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
    }
    if (uVar12 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar10 = uVar10 | uVar13 << ((byte)iVar8 & 0x1f);
    bVar15 = iVar8 != 0;
    iVar8 = iVar8 + -1;
  } while (bVar15);
  pnVar1->nal_ref_idc = uVar10;
  uVar10 = b->bits_left;
  pbVar11 = b->p;
  uVar12 = 0;
  iVar8 = 4;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    uVar13 = 0;
    if (pbVar11 < pbVar9) {
      uVar13 = (uint)((*pbVar11 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar12 = uVar12 | uVar13 << ((byte)iVar8 & 0x1f);
    bVar15 = iVar8 != 0;
    iVar8 = iVar8 + -1;
  } while (bVar15);
  pnVar1->nal_unit_type = uVar12;
  if (uVar12 == 0xe) {
LAB_0012203d:
    uVar10 = b->bits_left - 1;
    b->bits_left = uVar10;
    pbVar11 = b->p;
    if (pbVar11 < pbVar9) {
      _Var16 = (*pbVar11 >> (uVar10 & 0x1f) & 1) != 0;
    }
    else {
      _Var16 = false;
    }
    if (uVar10 == 0) {
      b->p = pbVar11 + 1;
      b->bits_left = 8;
    }
    pnVar1->svc_extension_flag = _Var16;
LAB_001220ab:
    if (pnVar1->svc_extension_flag == true) {
      read_nal_unit_header_svc_extension(pnVar1->nal_svc_ext,b);
    }
  }
  else {
    if (uVar12 == 0x15) {
      uVar10 = b->bits_left - 1;
      b->bits_left = uVar10;
      pbVar11 = b->p;
      if (pbVar11 < pbVar9) {
        _Var16 = (*pbVar11 >> (uVar10 & 0x1f) & 1) != 0;
      }
      else {
        _Var16 = false;
      }
      if (uVar10 == 0) {
        b->p = pbVar11 + 1;
        b->bits_left = 8;
      }
      pnVar1->avc_3d_extension_flag = _Var16;
      goto LAB_001220ab;
    }
    if (uVar12 == 0x14) goto LAB_0012203d;
  }
  switch(pnVar1->nal_unit_type) {
  case 1:
  case 5:
  case 0x13:
  case 0x14:
    read_slice_layer_rbsp(h,b);
    goto LAB_0012221d;
  default:
    free(b);
LAB_0012224d:
    free(rbsp_buf);
    return -1;
  case 7:
    read_seq_parameter_set_rbsp(h->sps,b);
    iVar8 = b->bits_left;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        b->p = b->p + 1;
        iVar8 = 8;
      }
    } while (iVar8 != 8);
    b->bits_left = 8;
    memcpy(h->sps_table[h->sps->seq_parameter_set_id],h->sps,0x1028);
    goto LAB_0012221d;
  case 8:
    read_pic_parameter_set_rbsp(h,b);
    iVar8 = b->bits_left;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        b->p = b->p + 1;
        iVar8 = 8;
      }
    } while (iVar8 != 8);
    iVar8 = 8;
    break;
  case 9:
    read_access_unit_delimiter_rbsp(h,b);
    iVar8 = b->bits_left;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        b->p = b->p + 1;
        iVar8 = 8;
      }
    } while (iVar8 != 8);
    iVar8 = 8;
    break;
  case 10:
    iVar8 = b->bits_left;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        b->p = b->p + 1;
        iVar8 = 8;
      }
    } while (iVar8 != 8);
    iVar8 = 8;
    break;
  case 0xb:
    iVar8 = b->bits_left;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        b->p = b->p + 1;
        iVar8 = 8;
      }
    } while (iVar8 != 8);
    iVar8 = 8;
    break;
  case 0xe:
    if (h->nal->svc_extension_flag == true) {
      read_prefix_nal_unit_svc(h->nal,b);
    }
    iVar8 = b->bits_left;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        b->p = b->p + 1;
        iVar8 = 8;
      }
    } while (iVar8 != 8);
    break;
  case 0xf:
    read_subset_seq_parameter_set_rbsp(h->sps_subset,b);
    iVar8 = b->bits_left;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        b->p = b->p + 1;
        iVar8 = 8;
      }
    } while (iVar8 != 8);
    b->bits_left = 8;
    psVar2 = h->sps_subset;
    uVar7 = *(undefined7 *)&psVar2->field_0x11;
    psVar3 = h->sps_subset_table[psVar2->sps->seq_parameter_set_id];
    psVar3->additional_extension2_flag = psVar2->additional_extension2_flag;
    *(undefined7 *)&psVar3->field_0x11 = uVar7;
    aVar6 = psVar2->field_1;
    psVar3->sps = psVar2->sps;
    psVar3->field_1 = aVar6;
    goto LAB_0012221d;
  }
  b->bits_left = iVar8;
LAB_0012221d:
  puVar4 = b->p;
  puVar5 = b->end;
  free(b);
  free(rbsp_buf);
  iVar8 = -1;
  if (puVar4 <= puVar5) {
    iVar8 = local_34;
  }
  return iVar8;
}

Assistant:

int read_nal_unit(h264_stream_t* h, uint8_t* buf, int size)
{
    nal_t* nal = h->nal;

    int nal_size = size;
    int rbsp_size = size;
    uint8_t* rbsp_buf = (uint8_t*)calloc(1, rbsp_size);

    if( 1 )
    {
        int rc = nal_to_rbsp(buf, &nal_size, rbsp_buf, &rbsp_size);

        if (rc < 0) { free(rbsp_buf); return -1; } // handle conversion error
    }

    if( 0 )
    {
        rbsp_size = size*3/4; // NOTE this may have to be slightly smaller (3/4 smaller, worst case) in order to be guaranteed to fit
    }

    bs_t* b = bs_new(rbsp_buf, rbsp_size);
    /* forbidden_zero_bit */ bs_skip_u(b, 1);
    nal->nal_ref_idc = bs_read_u(b, 2);
    nal->nal_unit_type = bs_read_u(b, 5);
    
    if( nal->nal_unit_type == 14 || nal->nal_unit_type == 21 || nal->nal_unit_type == 20 )
    {
        if( nal->nal_unit_type != 21 )
        {
            nal->svc_extension_flag = bs_read_u1(b);
        }
        else
        {
            nal->avc_3d_extension_flag = bs_read_u1(b);
        }
        
        if( nal->svc_extension_flag )
        {
            read_nal_unit_header_svc_extension(nal->nal_svc_ext, b);
        }
    }

    switch ( nal->nal_unit_type )
    {
        case NAL_UNIT_TYPE_CODED_SLICE_IDR:
        case NAL_UNIT_TYPE_CODED_SLICE_NON_IDR:  
        case NAL_UNIT_TYPE_CODED_SLICE_AUX:
            read_slice_layer_rbsp(h, b);
            break;

#ifdef HAVE_SEI
        case NAL_UNIT_TYPE_SEI:
            read_sei_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;
#endif

        case NAL_UNIT_TYPE_SPS: 
            read_seq_parameter_set_rbsp(h->sps, b);
            read_rbsp_trailing_bits(b);
            
            if( 1 )
            {
                memcpy(h->sps_table[h->sps->seq_parameter_set_id], h->sps, sizeof(sps_t));
            }

            break;

        case NAL_UNIT_TYPE_PPS:   
            read_pic_parameter_set_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_AUD:     
            read_access_unit_delimiter_rbsp(h, b); 
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_SEQUENCE: 
            read_end_of_seq_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_STREAM: 
            read_end_of_stream_rbsp(h, b);
            read_rbsp_trailing_bits(b);
            break;

        //SVC support
        case NAL_UNIT_TYPE_SUBSET_SPS:
            read_subset_seq_parameter_set_rbsp(h->sps_subset, b);
            read_rbsp_trailing_bits(b);
            
            if( 1 )
            {
                memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id], h->sps_subset, sizeof(sps_subset_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps, h->sps_subset->sps, sizeof(sps_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps_svc_ext, h->sps_subset->sps_svc_ext, sizeof(sps_svc_ext_t));
                //h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->additional_extension2_flag = h->sps_subset->additional_extension2_flag;
            }

            break;
            
        //prefix NAL
        case NAL_UNIT_TYPE_PREFIX_NAL:
            read_prefix_nal_unit_rbsp(h->nal, b);
            read_rbsp_trailing_bits(b);
            break;
            
        //SVC support
        case NAL_UNIT_TYPE_CODED_SLICE_SVC_EXTENSION:            
            read_slice_layer_rbsp(h, b);
            
            break;
            
        case NAL_UNIT_TYPE_FILLER:
        case NAL_UNIT_TYPE_SPS_EXT:
        case NAL_UNIT_TYPE_UNSPECIFIED:
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_A:  
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_B: 
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_C:
        default:
            bs_free(b);
            free(rbsp_buf);
            return -1;
    }

    if (bs_overrun(b)) { bs_free(b); free(rbsp_buf); return -1; }

    if( 0 )
    {
        // now get the actual size used
        rbsp_size = bs_pos(b);

        int rc = rbsp_to_nal(rbsp_buf, &rbsp_size, buf, &nal_size);
        if (rc < 0) { bs_free(b); free(rbsp_buf); return -1; }
    }

    bs_free(b);
    free(rbsp_buf);

    return nal_size;
}